

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

TPZTransform<double> *
pzshape::TPZShapeLinear::ParametricTransform
          (TPZTransform<double> *__return_storage_ptr__,int transid)

{
  double *pdVar1;
  double dVar2;
  
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,1,1);
  if (transid == 0) {
    pdVar1 = TPZFMatrix<double>::operator()
                       (&(__return_storage_ptr__->fMult).super_TPZFMatrix<double>,0,0);
    dVar2 = 1.0;
  }
  else {
    pdVar1 = TPZFMatrix<double>::operator()
                       (&(__return_storage_ptr__->fMult).super_TPZFMatrix<double>,0,0);
    dVar2 = -1.0;
  }
  *pdVar1 = dVar2;
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<REAL> TPZShapeLinear::ParametricTransform(int transid) {
        TPZTransform<REAL> trans(1,1);
        if (!transid) trans.Mult()(0,0) =  1;
        else          trans.Mult()(0,0) = -1;
        return trans;
    }